

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_analysis_nodes.h
# Opt level: O0

void __thiscall spvtools::opt::SECantCompute::~SECantCompute(SECantCompute *this)

{
  SECantCompute *this_local;
  
  ~SECantCompute(this);
  ::operator_delete(this,0x30);
  return;
}

Assistant:

explicit SECantCompute(ScalarEvolutionAnalysis* parent_analysis)
      : SENode(parent_analysis) {}